

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::MessageLite::SerializePartialToZeroCopyStream
          (MessageLite *this,ZeroCopyOutputStream *output)

{
  size_t stream_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  LogMessage *pLVar3;
  undefined4 extraout_var_00;
  undefined1 local_d8 [8];
  EpsCopyOutputStream stream;
  uint8_t *target;
  string local_80;
  LogMessage local_60;
  ulong local_28;
  size_t size;
  ZeroCopyOutputStream *output_local;
  MessageLite *this_local;
  
  size = (size_t)output;
  output_local = (ZeroCopyOutputStream *)this;
  iVar2 = (*this->_vptr_MessageLite[8])();
  stream_00 = size;
  local_28 = CONCAT44(extraout_var,iVar2);
  if (local_28 < 0x80000000) {
    bVar1 = io::CodedOutputStream::IsDefaultSerializationDeterministic();
    io::EpsCopyOutputStream::EpsCopyOutputStream
              ((EpsCopyOutputStream *)local_d8,(ZeroCopyOutputStream *)stream_00,bVar1,
               (uint8_t **)&stream.had_error_);
    iVar2 = (*this->_vptr_MessageLite[0xb])(this,stream._56_8_,local_d8);
    stream._56_8_ = CONCAT44(extraout_var_00,iVar2);
    io::EpsCopyOutputStream::Trim((EpsCopyOutputStream *)local_d8,(uint8_t *)stream._56_8_);
    bVar1 = io::EpsCopyOutputStream::HadError((EpsCopyOutputStream *)local_d8);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message_lite.cc"
               ,0x193);
    (*this->_vptr_MessageLite[2])(&local_80);
    pLVar3 = internal::LogMessage::operator<<(&local_60,&local_80);
    pLVar3 = internal::LogMessage::operator<<(pLVar3," exceeded maximum protobuf size of 2GB: ");
    pLVar3 = internal::LogMessage::operator<<(pLVar3,local_28);
    internal::LogFinisher::operator=((LogFinisher *)((long)&target + 3),pLVar3);
    std::__cxx11::string::~string((string *)&local_80);
    internal::LogMessage::~LogMessage(&local_60);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MessageLite::SerializePartialToZeroCopyStream(
    io::ZeroCopyOutputStream* output) const {
  const size_t size = ByteSizeLong();  // Force size to be cached.
  if (size > INT_MAX) {
    GOOGLE_LOG(ERROR) << GetTypeName()
               << " exceeded maximum protobuf size of 2GB: " << size;
    return false;
  }

  uint8_t* target;
  io::EpsCopyOutputStream stream(
      output, io::CodedOutputStream::IsDefaultSerializationDeterministic(),
      &target);
  target = _InternalSerialize(target, &stream);
  stream.Trim(target);
  if (stream.HadError()) return false;
  return true;
}